

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

PIPELINE_RESOURCE_FLAGS
Diligent::ShaderVariableFlagsToPipelineResourceFlags(SHADER_VARIABLE_FLAGS Flags)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  SHADER_VARIABLE_FLAGS Flags_local;
  
  switch(Flags) {
  case SHADER_VARIABLE_FLAG_NONE:
    msg.field_2._M_local_buf[0xf] = '\0';
    break;
  case SHADER_VARIABLE_FLAG_NO_DYNAMIC_BUFFERS:
    msg.field_2._M_local_buf[0xf] = '\x01';
    break;
  case SHADER_VARIABLE_FLAG_GENERAL_INPUT_ATTACHMENT_VK:
    msg.field_2._M_local_buf[0xf] = '\x10';
    break;
  default:
    msg.field_2._M_local_buf[0xe] = Flags;
    FormatString<char[32]>((string *)local_30,(char (*) [32])"Unexpected shader variable flag");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ShaderVariableFlagsToPipelineResourceFlags",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x743);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._M_local_buf[0xf] = '\0';
    break;
  case SHADER_VARIABLE_FLAG_UNFILTERABLE_FLOAT_TEXTURE_WEBGPU:
  case SHADER_VARIABLE_FLAG_LAST:
    msg.field_2._M_local_buf[0xf] = '\0';
  }
  return msg.field_2._M_local_buf[0xf];
}

Assistant:

PIPELINE_RESOURCE_FLAGS ShaderVariableFlagsToPipelineResourceFlags(SHADER_VARIABLE_FLAGS Flags)
{
    static_assert(SHADER_VARIABLE_FLAG_LAST == (1 << 3), "Please update the switch below to handle the new shader variable flags");
    switch (Flags)
    {
        case SHADER_VARIABLE_FLAG_NONE:
            return PIPELINE_RESOURCE_FLAG_NONE;

        case SHADER_VARIABLE_FLAG_NO_DYNAMIC_BUFFERS:
            return PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS;

        case SHADER_VARIABLE_FLAG_GENERAL_INPUT_ATTACHMENT_VK:
            return PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT;

        case SHADER_VARIABLE_FLAG_UNFILTERABLE_FLOAT_TEXTURE_WEBGPU:
        case SHADER_VARIABLE_FLAG_NON_FILTERING_SAMPLER_WEBGPU:
            return PIPELINE_RESOURCE_FLAG_NONE;

        default:
            UNEXPECTED("Unexpected shader variable flag");
            return PIPELINE_RESOURCE_FLAG_NONE;
    }
}